

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::pointer_writer<unsigned_long>&>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,
          pointer_writer<unsigned_long> *f)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  byte bVar7;
  char *pcVar8;
  buffer<char> *c;
  char __tmp_1;
  uint uVar9;
  unsigned_long uVar10;
  size_t __len_1;
  size_t __n;
  char __tmp;
  undefined2 *__s;
  size_t size;
  ulong uVar11;
  size_t __len;
  ulong uVar12;
  bool bVar13;
  
  uVar11 = (ulong)(uint)specs->width;
  uVar9 = f->num_digits + 2;
  uVar12 = (ulong)uVar9;
  puVar4 = *(undefined8 **)this;
  lVar5 = puVar4[2];
  if ((uint)specs->width <= uVar9) {
    uVar12 = lVar5 + uVar12;
    if ((ulong)puVar4[3] < uVar12) {
      (**(code **)*puVar4)(puVar4,uVar12);
    }
    puVar4[2] = uVar12;
    lVar6 = puVar4[1];
    *(undefined2 *)(lVar6 + lVar5) = 0x7830;
    pcVar8 = (char *)(lVar6 + f->num_digits + lVar5 + 1);
    uVar10 = f->value;
    do {
      *pcVar8 = "0123456789abcdef"[(uint)uVar10 & 0xf];
      pcVar8 = pcVar8 + -1;
      bVar13 = 0xf < uVar10;
      uVar10 = uVar10 >> 4;
    } while (bVar13);
    return;
  }
  uVar1 = uVar11 + lVar5;
  if ((ulong)puVar4[3] < uVar1) {
    (**(code **)*puVar4)(puVar4,uVar1);
  }
  puVar4[2] = uVar1;
  lVar6 = puVar4[1];
  __s = (undefined2 *)(lVar6 + lVar5);
  bVar3 = (specs->fill).data_[0];
  __n = uVar11 - uVar12;
  bVar7 = specs->field_0x9 & 0xf;
  if (bVar7 == 3) {
    uVar12 = __n >> 1;
    if (1 < __n) {
      memset(__s,(uint)bVar3,uVar12);
      __s = (undefined2 *)((long)__s + uVar12);
    }
    *__s = 0x7830;
    lVar2 = (long)__s + (long)f->num_digits;
    pcVar8 = (char *)((long)__s + (long)f->num_digits + 1);
    uVar10 = f->value;
    do {
      *pcVar8 = "0123456789abcdef"[(uint)uVar10 & 0xf];
      pcVar8 = pcVar8 + -1;
      bVar13 = 0xf < uVar10;
      uVar10 = uVar10 >> 4;
    } while (bVar13);
    __n = __n - uVar12;
  }
  else {
    if (bVar7 == 2) {
      memset(__s,(uint)bVar3,__n);
      *(undefined2 *)((long)__s + __n) = 0x7830;
      pcVar8 = (char *)(lVar6 + ((lVar5 + (long)f->num_digits + uVar11) - uVar12) + 1);
      uVar10 = f->value;
      do {
        *pcVar8 = "0123456789abcdef"[(uint)uVar10 & 0xf];
        pcVar8 = pcVar8 + -1;
        bVar13 = 0xf < uVar10;
        uVar10 = uVar10 >> 4;
      } while (bVar13);
      return;
    }
    *(undefined2 *)(lVar6 + lVar5) = 0x7830;
    lVar2 = (long)__s + (long)f->num_digits;
    pcVar8 = (char *)(lVar6 + lVar5 + f->num_digits + 1);
    uVar10 = f->value;
    do {
      *pcVar8 = "0123456789abcdef"[(uint)uVar10 & 0xf];
      pcVar8 = pcVar8 + -1;
      bVar13 = 0xf < uVar10;
      uVar10 = uVar10 >> 4;
    } while (bVar13);
  }
  memset((void *)(lVar2 + 2),(uint)bVar3,__n);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }